

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::namespace_uri_predicate::namespace_uri_predicate
          (namespace_uri_predicate *this,char_t *name)

{
  char_t *pcVar1;
  size_t local_38;
  char_t *local_30;
  char_t *pos;
  char_t *name_local;
  namespace_uri_predicate *this_local;
  
  pcVar1 = find_char(name,':');
  local_30 = name;
  if (pcVar1 == (char_t *)0x0) {
    local_30 = (char_t *)0x0;
  }
  this->prefix = local_30;
  if (pcVar1 == (char_t *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = (long)pcVar1 - (long)name;
  }
  this->prefix_length = local_38;
  return;
}

Assistant:

namespace_uri_predicate(const char_t* name)
		{
			const char_t* pos = find_char(name, ':');

			prefix = pos ? name : 0;
			prefix_length = pos ? static_cast<size_t>(pos - name) : 0;
		}